

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

ssize_t __thiscall
fmt::v6::internal::arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::internal::error_handler>
::write(arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::internal::error_handler> *this,
       int __fd,void *__buf,size_t __n)

{
  ulong uVar1;
  uint uVar2;
  format_specs *specs;
  buffer<char> *pbVar3;
  size_t sVar4;
  int iVar5;
  size_t __n_00;
  size_t extraout_RAX;
  undefined4 extraout_var;
  void *pvVar7;
  format_error *this_00;
  char *data;
  undefined4 in_register_00000034;
  char *__s;
  str_writer<char> local_38;
  size_t sVar6;
  
  __s = (char *)CONCAT44(in_register_00000034,__fd);
  if (__s == (char *)0x0) {
    this_00 = (format_error *)__cxa_allocate_exception(0x10);
    format_error::format_error(this_00,"string pointer is null");
    __cxa_throw(this_00,&format_error::typeinfo,format_error::~format_error);
  }
  __n_00 = strlen(__s);
  specs = this->specs_;
  if (specs == (format_specs *)0x0) {
    pbVar3 = (this->writer_).out_.container;
    sVar4 = pbVar3->size_;
    uVar1 = sVar4 + __n_00;
    sVar6 = __n_00;
    if (pbVar3->capacity_ < uVar1) {
      iVar5 = (**pbVar3->_vptr_buffer)(pbVar3,uVar1);
      sVar6 = CONCAT44(extraout_var,iVar5);
    }
    pbVar3->size_ = uVar1;
    if (__n_00 != 0) {
      pvVar7 = memmove(pbVar3->ptr_ + sVar4,__s,__n_00);
      return (ssize_t)pvVar7;
    }
  }
  else {
    uVar2 = specs->precision;
    local_38.size_ = (ulong)uVar2;
    if (__n_00 <= uVar2) {
      local_38.size_ = __n_00;
    }
    if ((int)uVar2 < 0) {
      local_38.size_ = __n_00;
    }
    local_38.s = __s;
    basic_writer<fmt::v6::buffer_range<char>>::
    write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::str_writer<char>>
              ((basic_writer<fmt::v6::buffer_range<char>> *)this,specs,&local_38);
    sVar6 = extraout_RAX;
  }
  return sVar6;
}

Assistant:

void write(const char_type* value) {
    if (!value) {
      FMT_THROW(format_error("string pointer is null"));
    } else {
      auto length = std::char_traits<char_type>::length(value);
      basic_string_view<char_type> sv(value, length);
      specs_ ? writer_.write(sv, *specs_) : writer_.write(sv);
    }
  }